

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O1

shared_ptr<chaiscript::Boxed_Value::Data> __thiscall
chaiscript::Boxed_Value::Object_Data::get<wchar_t>(Object_Data *this,wchar_t t,bool t_return_value)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar4;
  
  puVar1 = (undefined8 *)operator_new(0x18);
  puVar1[1] = 0x100000001;
  *puVar1 = &PTR___Sp_counted_ptr_inplace_003c8280;
  *(wchar_t *)(puVar1 + 2) = t;
  puVar2 = (undefined8 *)operator_new(0x20);
  puVar3 = puVar1 + 2;
  puVar2[1] = &std::shared_ptr<wchar_t>::typeinfo;
  *puVar2 = &PTR__Data_Impl_003c8310;
  puVar2[2] = puVar3;
  puVar2[3] = puVar1;
  *(undefined8 *)this = 0;
  puVar1 = (undefined8 *)operator_new(0x50);
  puVar1[1] = 0x100000001;
  *puVar1 = &PTR___Sp_counted_ptr_inplace_003c7798;
  puVar1[2] = &wchar_t::typeinfo;
  puVar1[3] = &wchar_t::typeinfo;
  *(undefined4 *)(puVar1 + 4) = 0x10;
  puVar1[5] = puVar2;
  puVar1[6] = puVar3;
  puVar1[7] = puVar3;
  puVar1[8] = 0;
  *(undefined1 *)(puVar1 + 9) = 0;
  *(bool *)((long)puVar1 + 0x49) = t_return_value;
  *(undefined8 **)(this + 8) = puVar1;
  *(undefined8 **)this = puVar1 + 2;
  sVar4.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&wchar_t::typeinfo;
  sVar4.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chaiscript::Boxed_Value::Data>)
         sVar4.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto get(T t, bool t_return_value) {
        auto p = std::make_shared<T>(std::move(t));
        auto ptr = p.get();
        return std::make_shared<Data>(detail::Get_Type_Info<T>::get(), chaiscript::detail::Any(std::move(p)), false, ptr, t_return_value);
      }